

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O1

void __thiscall soplex::NameSet::memPack(NameSet *this)

{
  pointer pEVar1;
  char *pcVar2;
  DataKey *pDVar3;
  undefined1 auVar4 [16];
  int iVar5;
  states *psVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  char *newmem;
  char *local_40;
  DataKey local_38;
  Name local_30;
  
  auVar4 = _DAT_003581b0;
  local_40 = (char *)0x0;
  pEVar1 = (this->hashtab).m_elem.data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (int)((long)(this->hashtab).m_elem.data.
                      super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 3) * -0x55555555;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)(uVar8 + 3 & 0xfffffffc);
    lVar10 = (ulong)(uVar8 & 0x7fffffff) - 1;
    auVar11._8_4_ = (int)lVar10;
    auVar11._0_8_ = lVar10;
    auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
    psVar6 = (states *)((long)(pEVar1 + 3) + 0x10);
    auVar11 = auVar11 ^ _DAT_003581b0;
    auVar12 = _DAT_00358190;
    auVar13 = _DAT_003581a0;
    do {
      auVar14 = auVar13 ^ auVar4;
      iVar5 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar5 && auVar11._0_4_ < auVar14._0_4_ || iVar5 < auVar14._4_4_)
                & 1)) {
        psVar6[-0x12] = 0;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        psVar6[-0xc] = 0;
      }
      auVar14 = auVar12 ^ auVar4;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar5 && (iVar15 != iVar5 || auVar14._0_4_ <= auVar11._0_4_)) {
        psVar6[-6] = 0;
        *psVar6 = FREE;
      }
      lVar10 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar10 + 4;
      lVar10 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar10 + 4;
      psVar6 = psVar6 + 0x18;
      uVar9 = uVar9 - 4;
    } while (uVar9 != 0);
  }
  (this->hashtab).m_used = 0;
  spx_alloc<char*>(&local_40,this->memused);
  if ((this->set).thenum < 1) {
    iVar5 = 0;
  }
  else {
    lVar10 = 0;
    iVar5 = 0;
    do {
      iVar15 = (this->set).theitem[(this->set).thekey[lVar10].idx].data;
      pcVar2 = this->mem;
      spxSnprintf(local_40 + iVar5,0x400,"%s",pcVar2 + iVar15);
      (this->set).theitem[(this->set).thekey[lVar10].idx].data = iVar5;
      sVar7 = strlen(pcVar2 + iVar15);
      iVar5 = (int)sVar7 + iVar5 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->set).thenum);
  }
  memcpy(this->mem,local_40,(long)iVar5);
  this->memused = iVar5;
  free(local_40);
  local_40 = (char *)0x0;
  if (0 < (this->set).thenum) {
    lVar10 = 0;
    do {
      pDVar3 = (this->set).thekey;
      local_30.name = this->mem + (this->set).theitem[pDVar3[lVar10].idx].data;
      local_38 = pDVar3[lVar10];
      DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::add(&this->hashtab,&local_30,&local_38)
      ;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->set).thenum);
  }
  return;
}

Assistant:

void NameSet::memPack()
{
   char* newmem = nullptr;
   int   newlast = 0;
   int   i;

   hashtab.clear();

   spx_alloc(newmem, memSize());

   for(i = 0; i < num(); i++)
   {
      const char* t = &mem[set[i]];
      spxSnprintf(&newmem[newlast], SPX_MAXSTRLEN, "%s", t);
      set[i] = newlast;
      newlast += int(strlen(t)) + 1;
   }

   memcpy(mem, newmem, static_cast<size_t>(newlast));
   memused = newlast;

   assert(memSize() <= memMax());

   spx_free(newmem);

   for(i = 0; i < num(); i++)
      hashtab.add(Name(&mem[set[key(i)]]), key(i));
}